

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
::_call<0>(cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>
           *this,vector *args,sequence<0> *param_3)

{
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)> *in_RDI;
  var *in_stack_00000100;
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *in_stack_ffffffffffffffd8;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
  try_convert_and_check<std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>,_0UL>
  ::convert(in_stack_00000100);
  std::function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&)>::
  operator()(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}